

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void * delpos234_internal(tree234 *t,int index)

{
  node234_conflict *pnVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  undefined8 local_f8;
  undefined8 local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  int local_cc;
  int local_c8;
  undefined8 local_c0;
  uint local_b0;
  int local_ac;
  int j_2;
  node234_conflict *b;
  node234_conflict *a;
  void *target_1;
  node234_conflict *m_1;
  void *target;
  node234_conflict *m;
  int local_70;
  int childnum;
  int i;
  int j_1;
  node234_conflict *sib_2;
  int j;
  node234_conflict *sib_1;
  int lastelem;
  node234_conflict *sib;
  node234_conflict *sub;
  int ki;
  int ei;
  void *retval;
  node234_conflict *n;
  int index_local;
  tree234 *t_local;
  
  sub._4_4_ = -1;
  _ki = (void *)0x0;
  retval = t->root;
  n._4_4_ = index;
  do {
    while (retval == (void *)0x0) {
LAB_00120ad0:
      if (_ki == (void *)0x0) {
        _ki = *(void **)((long)retval + (long)sub._4_4_ * 8 + 0x38);
      }
      if (sub._4_4_ == -1) {
        return (void *)0x0;
      }
      if (((*retval == 0) && (*(long *)((long)retval + 0x40) == 0)) &&
         (*(long *)((long)retval + 8) == 0)) {
        safefree(retval);
        t->root = (node234_conflict *)0x0;
        return _ki;
      }
      if ((*(long *)((long)retval + 8) == 0) && (*(long *)((long)retval + 0x40) != 0)) {
        local_70 = sub._4_4_;
        while( true ) {
          bVar5 = false;
          if (local_70 < 2) {
            bVar5 = *(long *)((long)retval + (long)(local_70 + 1) * 8 + 0x38) != 0;
          }
          if (!bVar5) break;
          *(undefined8 *)((long)retval + (long)local_70 * 8 + 0x38) =
               *(undefined8 *)((long)retval + (long)(local_70 + 1) * 8 + 0x38);
          local_70 = local_70 + 1;
        }
        *(undefined8 *)((long)retval + (long)local_70 * 8 + 0x38) = 0;
        for (; *retval != 0; retval = *retval) {
          if (*(void **)(*retval + 8) == retval) {
            local_c8 = 0;
          }
          else {
            if (*(void **)(*retval + 0x10) == retval) {
              local_cc = 1;
            }
            else {
              local_cc = 3;
              if (*(void **)(*retval + 0x18) == retval) {
                local_cc = 2;
              }
            }
            local_c8 = local_cc;
          }
          *(int *)(*retval + 0x28 + (long)local_c8 * 4) =
               *(int *)(*retval + 0x28 + (long)local_c8 * 4) + -1;
        }
        return _ki;
      }
      if (*(long *)(*(long *)((long)retval + (long)sub._4_4_ * 8 + 8) + 0x40) == 0) {
        if (*(long *)(*(long *)((long)retval + (long)(sub._4_4_ + 1) * 8 + 8) + 0x40) == 0) {
          pnVar1 = *(node234_conflict **)((long)retval + (long)sub._4_4_ * 8 + 8);
          pvVar2 = *(void **)((long)retval + (long)(sub._4_4_ + 1) * 8 + 8);
          pnVar1->elems[1] = *(void **)((long)retval + (long)sub._4_4_ * 8 + 0x38);
          pnVar1->kids[2] = *(node234 **)((long)pvVar2 + 8);
          pnVar1->counts[2] = *(int *)((long)pvVar2 + 0x28);
          if (pnVar1->kids[2] != (node234 *)0x0) {
            pnVar1->kids[2]->parent = pnVar1;
          }
          pnVar1->elems[2] = *(void **)((long)pvVar2 + 0x38);
          pnVar1->kids[3] = *(node234 **)((long)pvVar2 + 0x10);
          pnVar1->counts[3] = *(int *)((long)pvVar2 + 0x2c);
          if (pnVar1->kids[3] != (node234 *)0x0) {
            pnVar1->kids[3]->parent = pnVar1;
          }
          safefree(pvVar2);
          iVar3 = countnode234(pnVar1);
          *(int *)((long)retval + (long)sub._4_4_ * 4 + 0x28) = iVar3;
          local_ac = sub._4_4_;
          while( true ) {
            bVar5 = false;
            if (local_ac < 2) {
              bVar5 = *(long *)((long)retval + (long)(local_ac + 1) * 8 + 0x38) != 0;
            }
            if (!bVar5) break;
            *(undefined8 *)((long)retval + (long)local_ac * 8 + 0x38) =
                 *(undefined8 *)((long)retval + (long)(local_ac + 1) * 8 + 0x38);
            *(undefined8 *)((long)retval + (long)(local_ac + 1) * 8 + 8) =
                 *(undefined8 *)((long)retval + (long)(local_ac + 2) * 8 + 8);
            *(undefined4 *)((long)retval + (long)(local_ac + 1) * 4 + 0x28) =
                 *(undefined4 *)((long)retval + (long)(local_ac + 2) * 4 + 0x28);
            local_ac = local_ac + 1;
          }
          *(undefined8 *)((long)retval + (long)local_ac * 8 + 0x38) = 0;
          *(undefined8 *)((long)retval + (long)(local_ac + 1) * 8 + 8) = 0;
          *(undefined4 *)((long)retval + (long)(local_ac + 1) * 4 + 0x28) = 0;
          if (*(long *)((long)retval + 0x38) == 0) {
            t->root = pnVar1;
            pnVar1->parent = (node234_conflict *)0x0;
            safefree(retval);
          }
          n._4_4_ = pnVar1->counts[0] + pnVar1->counts[1] + 1;
          retval = pnVar1;
        }
        else {
          for (target_1 = *(void **)((long)retval + (long)(sub._4_4_ + 1) * 8 + 8);
              *(long *)((long)target_1 + 8) != 0; target_1 = *(void **)((long)target_1 + 8)) {
          }
          *(undefined8 *)((long)retval + (long)sub._4_4_ * 8 + 0x38) =
               *(undefined8 *)((long)target_1 + 0x38);
          n._4_4_ = 0;
          retval = *(void **)((long)retval + (long)(sub._4_4_ + 1) * 8 + 8);
        }
      }
      else {
        target = *(void **)((long)retval + (long)sub._4_4_ * 8 + 8);
        while (*(long *)((long)target + 8) != 0) {
          if (*(long *)((long)target + 0x20) == 0) {
            if (*(long *)((long)target + 0x18) == 0) {
              if (*(long *)((long)target + 0x10) == 0) {
                local_e8 = *(void **)((long)target + 8);
              }
              else {
                local_e8 = *(void **)((long)target + 0x10);
              }
              local_e0 = local_e8;
            }
            else {
              local_e0 = *(void **)((long)target + 0x18);
            }
            local_d8 = local_e0;
          }
          else {
            local_d8 = *(void **)((long)target + 0x20);
          }
          target = local_d8;
        }
        if (*(long *)((long)target + 0x48) == 0) {
          if (*(long *)((long)target + 0x40) == 0) {
            local_f8 = *(undefined8 *)((long)target + 0x38);
          }
          else {
            local_f8 = *(undefined8 *)((long)target + 0x40);
          }
          local_f0 = local_f8;
        }
        else {
          local_f0 = *(undefined8 *)((long)target + 0x48);
        }
        *(undefined8 *)((long)retval + (long)sub._4_4_ * 8 + 0x38) = local_f0;
        n._4_4_ = *(int *)((long)retval + (long)sub._4_4_ * 4 + 0x28) + -1;
        retval = *(void **)((long)retval + (long)sub._4_4_ * 8 + 8);
      }
    }
    if (n._4_4_ < *(int *)((long)retval + 0x28)) {
      sub._0_4_ = 0;
    }
    else {
      n._4_4_ = n._4_4_ - (*(int *)((long)retval + 0x28) + 1);
      if (n._4_4_ < 0) {
        sub._4_4_ = 0;
        goto LAB_00120ad0;
      }
      if (n._4_4_ < *(int *)((long)retval + 0x2c)) {
        sub._0_4_ = 1;
      }
      else {
        n._4_4_ = n._4_4_ - (*(int *)((long)retval + 0x2c) + 1);
        if (n._4_4_ < 0) {
          sub._4_4_ = 1;
          goto LAB_00120ad0;
        }
        if (n._4_4_ < *(int *)((long)retval + 0x30)) {
          sub._0_4_ = 2;
        }
        else {
          n._4_4_ = n._4_4_ - (*(int *)((long)retval + 0x30) + 1);
          if (n._4_4_ < 0) {
            sub._4_4_ = 2;
            goto LAB_00120ad0;
          }
          sub._0_4_ = 3;
        }
      }
    }
    sib = *(node234_conflict **)((long)retval + (long)(int)(uint)sub * 8 + 8);
    if (sib->elems[1] == (void *)0x0) {
      if (((uint)sub == 0) ||
         (*(long *)(*(long *)((long)retval + (long)(int)((uint)sub - 1) * 8 + 8) + 0x40) == 0)) {
        if (((uint)sub < 3) &&
           ((*(long *)((long)retval + (long)(int)((uint)sub + 1) * 8 + 8) != 0 &&
            (*(long *)(*(long *)((long)retval + (long)(int)((uint)sub + 1) * 8 + 8) + 0x40) != 0))))
        {
          pnVar1 = *(node234_conflict **)((long)retval + (long)(int)((uint)sub + 1) * 8 + 8);
          sib->elems[1] = *(void **)((long)retval + (long)(int)(uint)sub * 8 + 0x38);
          sib->kids[2] = pnVar1->kids[0];
          sib->counts[2] = pnVar1->counts[0];
          if (sib->kids[2] != (node234 *)0x0) {
            sib->kids[2]->parent = sib;
          }
          *(void **)((long)retval + (long)(int)(uint)sub * 8 + 0x38) = pnVar1->elems[0];
          pnVar1->kids[0] = pnVar1->kids[1];
          pnVar1->counts[0] = pnVar1->counts[1];
          sib_2._4_4_ = 0;
          while( true ) {
            bVar5 = false;
            if (sib_2._4_4_ < 2) {
              bVar5 = pnVar1->elems[sib_2._4_4_ + 1] != (void *)0x0;
            }
            if (!bVar5) break;
            pnVar1->kids[sib_2._4_4_ + 1] = pnVar1->kids[sib_2._4_4_ + 2];
            pnVar1->counts[sib_2._4_4_ + 1] = pnVar1->counts[sib_2._4_4_ + 2];
            pnVar1->elems[sib_2._4_4_] = pnVar1->elems[sib_2._4_4_ + 1];
            sib_2._4_4_ = sib_2._4_4_ + 1;
          }
          pnVar1->kids[sib_2._4_4_ + 1] = (node234 *)0x0;
          pnVar1->counts[sib_2._4_4_ + 1] = 0;
          pnVar1->elems[sib_2._4_4_] = (void *)0x0;
          iVar3 = countnode234(sib);
          *(int *)((long)retval + (long)(int)(uint)sub * 4 + 0x28) = iVar3;
          iVar3 = countnode234(pnVar1);
          *(int *)((long)retval + (long)(int)((uint)sub + 1) * 4 + 0x28) = iVar3;
        }
        else {
          if ((uint)sub != 0) {
            sub._0_4_ = (uint)sub - 1;
            n._4_4_ = *(int *)((long)retval + (long)(int)(uint)sub * 4 + 0x28) + 1 + n._4_4_;
          }
          pvVar2 = *(void **)((long)retval + (long)(int)(uint)sub * 8 + 8);
          sib = *(node234_conflict **)((long)retval + (long)(int)((uint)sub + 1) * 8 + 8);
          sib->kids[3] = sib->kids[1];
          sib->counts[3] = sib->counts[1];
          sib->elems[2] = sib->elems[0];
          sib->kids[2] = sib->kids[0];
          sib->counts[2] = sib->counts[0];
          sib->elems[1] = *(void **)((long)retval + (long)(int)(uint)sub * 8 + 0x38);
          sib->kids[1] = *(node234 **)((long)pvVar2 + 0x10);
          sib->counts[1] = *(int *)((long)pvVar2 + 0x2c);
          if (sib->kids[1] != (node234 *)0x0) {
            sib->kids[1]->parent = sib;
          }
          sib->elems[0] = *(void **)((long)pvVar2 + 0x38);
          sib->kids[0] = *(node234 **)((long)pvVar2 + 8);
          sib->counts[0] = *(int *)((long)pvVar2 + 0x28);
          if (sib->kids[0] != (node234 *)0x0) {
            sib->kids[0]->parent = sib;
          }
          iVar3 = countnode234(sib);
          *(int *)((long)retval + (long)(int)((uint)sub + 1) * 4 + 0x28) = iVar3;
          safefree(pvVar2);
          childnum = (uint)sub;
          while( true ) {
            bVar5 = false;
            if (childnum < 3) {
              bVar5 = *(long *)((long)retval + (long)(childnum + 1) * 8 + 8) != 0;
            }
            if (!bVar5) break;
            *(undefined8 *)((long)retval + (long)childnum * 8 + 8) =
                 *(undefined8 *)((long)retval + (long)(childnum + 1) * 8 + 8);
            *(undefined4 *)((long)retval + (long)childnum * 4 + 0x28) =
                 *(undefined4 *)((long)retval + (long)(childnum + 1) * 4 + 0x28);
            if (childnum < 2) {
              local_c0 = *(undefined8 *)((long)retval + (long)(childnum + 1) * 8 + 0x38);
            }
            else {
              local_c0 = 0;
            }
            *(undefined8 *)((long)retval + (long)childnum * 8 + 0x38) = local_c0;
            childnum = childnum + 1;
          }
          *(undefined8 *)((long)retval + (long)childnum * 8 + 8) = 0;
          *(undefined4 *)((long)retval + (long)childnum * 4 + 0x28) = 0;
          if (childnum < 3) {
            *(undefined8 *)((long)retval + (long)childnum * 8 + 0x38) = 0;
          }
          if (*(long *)((long)retval + 0x38) == 0) {
            t->root = sib;
            sib->parent = (node234_conflict *)0x0;
            safefree(retval);
          }
        }
      }
      else {
        pnVar1 = *(node234_conflict **)((long)retval + (long)(int)((uint)sub - 1) * 8 + 8);
        if (pnVar1->elems[2] == (void *)0x0) {
          local_b0 = (uint)(pnVar1->elems[1] != (void *)0x0);
        }
        else {
          local_b0 = 2;
        }
        sib->kids[2] = sib->kids[1];
        sib->counts[2] = sib->counts[1];
        sib->elems[1] = sib->elems[0];
        sib->kids[1] = sib->kids[0];
        sib->counts[1] = sib->counts[0];
        sib->elems[0] = *(void **)((long)retval + (long)(int)((uint)sub - 1) * 8 + 0x38);
        sib->kids[0] = pnVar1->kids[(int)(local_b0 + 1)];
        sib->counts[0] = pnVar1->counts[(int)(local_b0 + 1)];
        if (sib->kids[0] != (node234 *)0x0) {
          sib->kids[0]->parent = sib;
        }
        *(void **)((long)retval + (long)(int)((uint)sub - 1) * 8 + 0x38) =
             pnVar1->elems[(int)local_b0];
        pnVar1->kids[(int)(local_b0 + 1)] = (node234 *)0x0;
        pnVar1->counts[(int)(local_b0 + 1)] = 0;
        pnVar1->elems[(int)local_b0] = (void *)0x0;
        iVar3 = countnode234(sib);
        *(int *)((long)retval + (long)(int)(uint)sub * 4 + 0x28) = iVar3;
        iVar3 = *(int *)((long)retval + (long)(int)((uint)sub - 1) * 4 + 0x28);
        iVar4 = countnode234(pnVar1);
        *(int *)((long)retval + (long)(int)((uint)sub - 1) * 4 + 0x28) = iVar4;
        n._4_4_ = (iVar3 + n._4_4_) - *(int *)((long)retval + (long)(int)((uint)sub - 1) * 4 + 0x28)
        ;
      }
    }
    retval = sib;
  } while( true );
}

Assistant:

static void *delpos234_internal(tree234 * t, int index)
{
    node234 *n;
    void *retval;
    int ei = -1;

    retval = 0;

    n = t->root;
    LOG(("deleting item %d from tree %p\n", index, t));
    while (1) {
        while (n) {
            int ki;
            node234 *sub;

            LOG(
                ("  node %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d index=%d\n",
                 n, n->kids[0], n->counts[0], n->elems[0], n->kids[1],
                 n->counts[1], n->elems[1], n->kids[2], n->counts[2],
                 n->elems[2], n->kids[3], n->counts[3], index));
            if (index < n->counts[0]) {
                ki = 0;
            } else if (index -= n->counts[0] + 1, index < 0) {
                ei = 0;
                break;
            } else if (index < n->counts[1]) {
                ki = 1;
            } else if (index -= n->counts[1] + 1, index < 0) {
                ei = 1;
                break;
            } else if (index < n->counts[2]) {
                ki = 2;
            } else if (index -= n->counts[2] + 1, index < 0) {
                ei = 2;
                break;
            } else {
                ki = 3;
            }
            /*
             * Recurse down to subtree ki. If it has only one element,
             * we have to do some transformation to start with.
             */
            LOG(("  moving to subtree %d\n", ki));
            sub = n->kids[ki];
            if (!sub->elems[1]) {
                LOG(("  subtree has only one element!\n"));
                if (ki > 0 && n->kids[ki - 1]->elems[1]) {
                    /*
                     * Case 3a, left-handed variant. Child ki has
                     * only one element, but child ki-1 has two or
                     * more. So we need to move a subtree from ki-1
                     * to ki.
                     *
                     *                . C .                     . B .
                     *               /     \     ->            /     \
                     * [more] a A b B c   d D e      [more] a A b   c C d D e
                     */
                    node234 *sib = n->kids[ki - 1];
                    int lastelem = (sib->elems[2] ? 2 :
                                    sib->elems[1] ? 1 : 0);
                    sub->kids[2] = sub->kids[1];
                    sub->counts[2] = sub->counts[1];
                    sub->elems[1] = sub->elems[0];
                    sub->kids[1] = sub->kids[0];
                    sub->counts[1] = sub->counts[0];
                    sub->elems[0] = n->elems[ki - 1];
                    sub->kids[0] = sib->kids[lastelem + 1];
                    sub->counts[0] = sib->counts[lastelem + 1];
                    if (sub->kids[0])
                        sub->kids[0]->parent = sub;
                    n->elems[ki - 1] = sib->elems[lastelem];
                    sib->kids[lastelem + 1] = NULL;
                    sib->counts[lastelem + 1] = 0;
                    sib->elems[lastelem] = NULL;
                    n->counts[ki] = countnode234(sub);
                    LOG(("  case 3a left\n"));
                    LOG(
                        ("  index and left subtree count before adjustment: %d, %d\n",
                         index, n->counts[ki - 1]));
                    index += n->counts[ki - 1];
                    n->counts[ki - 1] = countnode234(sib);
                    index -= n->counts[ki - 1];
                    LOG(
                        ("  index and left subtree count after adjustment: %d, %d\n",
                         index, n->counts[ki - 1]));
                } else if (ki < 3 && n->kids[ki + 1]
                           && n->kids[ki + 1]->elems[1]) {
                    /*
                     * Case 3a, right-handed variant. ki has only
                     * one element but ki+1 has two or more. Move a
                     * subtree from ki+1 to ki.
                     *
                     *      . B .                             . C .
                     *     /     \                ->         /     \
                     *  a A b   c C d D e [more]      a A b B c   d D e [more]
                     */
                    node234 *sib = n->kids[ki + 1];
                    int j;
                    sub->elems[1] = n->elems[ki];
                    sub->kids[2] = sib->kids[0];
                    sub->counts[2] = sib->counts[0];
                    if (sub->kids[2])
                        sub->kids[2]->parent = sub;
                    n->elems[ki] = sib->elems[0];
                    sib->kids[0] = sib->kids[1];
                    sib->counts[0] = sib->counts[1];
                    for (j = 0; j < 2 && sib->elems[j + 1]; j++) {
                        sib->kids[j + 1] = sib->kids[j + 2];
                        sib->counts[j + 1] = sib->counts[j + 2];
                        sib->elems[j] = sib->elems[j + 1];
                    }
                    sib->kids[j + 1] = NULL;
                    sib->counts[j + 1] = 0;
                    sib->elems[j] = NULL;
                    n->counts[ki] = countnode234(sub);
                    n->counts[ki + 1] = countnode234(sib);
                    LOG(("  case 3a right\n"));
                } else {
                    /*
                     * Case 3b. ki has only one element, and has no
                     * neighbour with more than one. So pick a
                     * neighbour and merge it with ki, taking an
                     * element down from n to go in the middle.
                     *
                     *      . B .                .
                     *     /     \     ->        |
                     *  a A b   c C d      a A b B c C d
                     *
                     * (Since at all points we have avoided
                     * descending to a node with only one element,
                     * we can be sure that n is not reduced to
                     * nothingness by this move, _unless_ it was
                     * the very first node, ie the root of the
                     * tree. In that case we remove the now-empty
                     * root and replace it with its single large
                     * child as shown.)
                     */
                    node234 *sib;
                    int j;

                    if (ki > 0) {
                        ki--;
                        index += n->counts[ki] + 1;
                    }
                    sib = n->kids[ki];
                    sub = n->kids[ki + 1];

                    sub->kids[3] = sub->kids[1];
                    sub->counts[3] = sub->counts[1];
                    sub->elems[2] = sub->elems[0];
                    sub->kids[2] = sub->kids[0];
                    sub->counts[2] = sub->counts[0];
                    sub->elems[1] = n->elems[ki];
                    sub->kids[1] = sib->kids[1];
                    sub->counts[1] = sib->counts[1];
                    if (sub->kids[1])
                        sub->kids[1]->parent = sub;
                    sub->elems[0] = sib->elems[0];
                    sub->kids[0] = sib->kids[0];
                    sub->counts[0] = sib->counts[0];
                    if (sub->kids[0])
                        sub->kids[0]->parent = sub;

                    n->counts[ki + 1] = countnode234(sub);

                    sfree(sib);

                    /*
                     * That's built the big node in sub. Now we
                     * need to remove the reference to sib in n.
                     */
                    for (j = ki; j < 3 && n->kids[j + 1]; j++) {
                        n->kids[j] = n->kids[j + 1];
                        n->counts[j] = n->counts[j + 1];
                        n->elems[j] = j < 2 ? n->elems[j + 1] : NULL;
                    }
                    n->kids[j] = NULL;
                    n->counts[j] = 0;
                    if (j < 3)
                        n->elems[j] = NULL;
                    LOG(("  case 3b ki=%d\n", ki));

                    if (!n->elems[0]) {
                        /*
                         * The root is empty and needs to be
                         * removed.
                         */
                        LOG(("  shifting root!\n"));
                        t->root = sub;
                        sub->parent = NULL;
                        sfree(n);
                    }
                }
            }
            n = sub;
        }
        if (!retval)
            retval = n->elems[ei];

        if (ei == -1)
            return NULL;               /* although this shouldn't happen */

        /*
         * Treat special case: this is the one remaining item in
         * the tree. n is the tree root (no parent), has one
         * element (no elems[1]), and has no kids (no kids[0]).
         */
        if (!n->parent && !n->elems[1] && !n->kids[0]) {
            LOG(("  removed last element in tree\n"));
            sfree(n);
            t->root = NULL;
            return retval;
        }

        /*
         * Now we have the element we want, as n->elems[ei], and we
         * have also arranged for that element not to be the only
         * one in its node. So...
         */

        if (!n->kids[0] && n->elems[1]) {
            /*
             * Case 1. n is a leaf node with more than one element,
             * so it's _really easy_. Just delete the thing and
             * we're done.
             */
            int i;
            LOG(("  case 1\n"));
            for (i = ei; i < 2 && n->elems[i + 1]; i++)
                n->elems[i] = n->elems[i + 1];
            n->elems[i] = NULL;
            /*
             * Having done that to the leaf node, we now go back up
             * the tree fixing the counts.
             */
            while (n->parent) {
                int childnum;
                childnum = (n->parent->kids[0] == n ? 0 :
                            n->parent->kids[1] == n ? 1 :
                            n->parent->kids[2] == n ? 2 : 3);
                n->parent->counts[childnum]--;
                n = n->parent;
            }
            return retval;             /* finished! */
        } else if (n->kids[ei]->elems[1]) {
            /*
             * Case 2a. n is an internal node, and the root of the
             * subtree to the left of e has more than one element.
             * So find the predecessor p to e (ie the largest node
             * in that subtree), place it where e currently is, and
             * then start the deletion process over again on the
             * subtree with p as target.
             */
            node234 *m = n->kids[ei];
            void *target;
            LOG(("  case 2a\n"));
            while (m->kids[0]) {
                m = (m->kids[3] ? m->kids[3] :
                     m->kids[2] ? m->kids[2] :
                     m->kids[1] ? m->kids[1] : m->kids[0]);
            }
            target = (m->elems[2] ? m->elems[2] :
                      m->elems[1] ? m->elems[1] : m->elems[0]);
            n->elems[ei] = target;
            index = n->counts[ei] - 1;
            n = n->kids[ei];
        } else if (n->kids[ei + 1]->elems[1]) {
            /*
             * Case 2b, symmetric to 2a but s/left/right/ and
             * s/predecessor/successor/. (And s/largest/smallest/).
             */
            node234 *m = n->kids[ei + 1];
            void *target;
            LOG(("  case 2b\n"));
            while (m->kids[0]) {
                m = m->kids[0];
            }
            target = m->elems[0];
            n->elems[ei] = target;
            n = n->kids[ei + 1];
            index = 0;
        } else {
            /*
             * Case 2c. n is an internal node, and the subtrees to
             * the left and right of e both have only one element.
             * So combine the two subnodes into a single big node
             * with their own elements on the left and right and e
             * in the middle, then restart the deletion process on
             * that subtree, with e still as target.
             */
            node234 *a = n->kids[ei], *b = n->kids[ei + 1];
            int j;

            LOG(("  case 2c\n"));
            a->elems[1] = n->elems[ei];
            a->kids[2] = b->kids[0];
            a->counts[2] = b->counts[0];
            if (a->kids[2])
                a->kids[2]->parent = a;
            a->elems[2] = b->elems[0];
            a->kids[3] = b->kids[1];
            a->counts[3] = b->counts[1];
            if (a->kids[3])
                a->kids[3]->parent = a;
            sfree(b);
            n->counts[ei] = countnode234(a);
            /*
             * That's built the big node in a, and destroyed b. Now
             * remove the reference to b (and e) in n.
             */
            for (j = ei; j < 2 && n->elems[j + 1]; j++) {
                n->elems[j] = n->elems[j + 1];
                n->kids[j + 1] = n->kids[j + 2];
                n->counts[j + 1] = n->counts[j + 2];
            }
            n->elems[j] = NULL;
            n->kids[j + 1] = NULL;
            n->counts[j + 1] = 0;
            /*
             * It's possible, in this case, that we've just removed
             * the only element in the root of the tree. If so,
             * shift the root.
             */
            if (n->elems[0] == NULL) {
                LOG(("  shifting root!\n"));
                t->root = a;
                a->parent = NULL;
                sfree(n);
            }
            /*
             * Now go round the deletion process again, with n
             * pointing at the new big node and e still the same.
             */
            n = a;
            index = a->counts[0] + a->counts[1] + 1;
        }
    }
}